

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intercept.cpp
# Opt level: O3

void __thiscall
CLIntercept::callLoggingExit
          (CLIntercept *this,char *functionName,cl_int errorCode,cl_event *event,
          cl_sync_point_khr *syncPoint)

{
  mutex *__mutex;
  int iVar1;
  undefined8 uVar2;
  double __x;
  string str;
  string local_70;
  string local_50;
  
  __mutex = &this->m_Mutex;
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (iVar1 == 0) {
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"<<<< ","");
    getCallLoggingPrefix(this,&local_70);
    std::__cxx11::string::append((char *)&local_70);
    if (event != (cl_event *)0x0) {
      snprintf(this->m_StringBuffer,0x4000," created event = %p",*event);
      std::__cxx11::string::append((char *)&local_70);
    }
    if (syncPoint != (cl_sync_point_khr *)0x0) {
      snprintf(this->m_StringBuffer,0x4000," is sync point = %u",(ulong)*syncPoint);
      std::__cxx11::string::append((char *)&local_70);
    }
    std::__cxx11::string::append((char *)&local_70);
    CEnumNameMap::name_abi_cxx11_(&local_50,&this->m_EnumNameMap,errorCode);
    std::__cxx11::string::_M_append((char *)&local_70,(ulong)local_50._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    __x = (double)std::__cxx11::string::append((char *)&local_70);
    log(this,__x);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p);
    }
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    return;
  }
  uVar2 = std::__throw_system_error(iVar1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  _Unwind_Resume(uVar2);
}

Assistant:

void CLIntercept::callLoggingExit(
    const char* functionName,
    const cl_int errorCode,
    const cl_event* event,
    const cl_sync_point_khr* syncPoint )
{
    std::lock_guard<std::mutex> lock(m_Mutex);

    std::string str("<<<< ");
    getCallLoggingPrefix( str );

    str += functionName;

    if( event )
    {
        CLI_SPRINTF( m_StringBuffer, CLI_STRING_BUFFER_SIZE, " created event = %p", *event );
        str += m_StringBuffer;
    }
    if( syncPoint )
    {
        CLI_SPRINTF( m_StringBuffer, CLI_STRING_BUFFER_SIZE, " is sync point = %u", *syncPoint );
        str += m_StringBuffer;
    }

    str += " -> ";
    str += m_EnumNameMap.name( errorCode );
    str += "\n";

    log( str );
}